

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:942:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:942:17)>
             *this)

{
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *this_00;
  Disposer *pDVar1;
  PromiseFulfiller<void> *pPVar2;
  ReducePromises<void> node;
  CrossThreadPromiseFulfiller<void> *pCVar3;
  Executor *this_01;
  PromiseCrossThreadFulfillerPair<void> paf;
  WaitScope waitScope;
  NullableValue<kj::Exception> _e950;
  EventLoop loop;
  DebugExpression<bool> _kjCondition;
  UnixEventPort port;
  PromiseCrossThreadFulfillerPair<void> local_5b0;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  char *local_530;
  char *pcStack_528;
  undefined8 local_520;
  EventLoop *local_518;
  undefined4 local_510;
  long local_508;
  undefined8 uStack_500;
  char local_4d8;
  Exception local_4d0;
  EventLoop local_338 [4];
  UnixEventPort local_128;
  
  UnixEventPort::UnixEventPort(&local_128);
  EventLoop::EventLoop(local_338,&local_128.super_EventPort);
  local_510 = 0xffffffff;
  local_508 = 0;
  uStack_500 = 0;
  local_518 = local_338;
  EventLoop::enterScope(local_338);
  this_01 = getCurrentThreadExecutor();
  Executor::newPromiseAndCrossThreadFulfiller<void>(&local_5b0,this_01);
  local_598 = local_5b0.fulfiller.disposer._0_4_;
  uStack_594 = local_5b0.fulfiller.disposer._4_4_;
  uStack_590 = local_5b0.fulfiller.ptr._0_4_;
  uStack_58c = local_5b0.fulfiller.ptr._4_4_;
  local_5b0.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
  this_00 = (this->f).fulfillerMutex;
  local_4d8 = 0;
  kj::_::Mutex::lock(&this_00->mutex,0);
  pDVar1 = (this_00->value).ptr.disposer;
  pPVar2 = (this_00->value).ptr.ptr;
  *(undefined4 *)&(this_00->value).ptr.disposer = local_598;
  *(undefined4 *)((long)&(this_00->value).ptr.disposer + 4) = uStack_594;
  *(undefined4 *)&(this_00->value).ptr.ptr = uStack_590;
  *(undefined4 *)((long)&(this_00->value).ptr.ptr + 4) = uStack_58c;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (**pDVar1->_vptr_Disposer)();
  }
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_528 = "operator()";
  local_520 = 0x24000003b6;
  Promise<void>::wait(&local_5b0.promise,&local_518);
  local_4d8 = '\0';
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x3b6,ERROR,"\"code did not throw: \" \"paf.promise.wait(waitScope)\"",
               (char (*) [48])"code did not throw: paf.promise.wait(waitScope)");
  }
  if (local_4d8 == '\x01') {
    Exception::~Exception(&local_4d0);
  }
  pCVar3 = local_5b0.fulfiller.ptr;
  if (local_5b0.fulfiller.ptr != (CrossThreadPromiseFulfiller<void> *)0x0) {
    local_5b0.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_5b0.fulfiller.disposer._4_4_,local_5b0.fulfiller.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_5b0.fulfiller.disposer._4_4_,local_5b0.fulfiller.disposer._0_4_),
               (pCVar3->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector
               [-2] + (long)&(pCVar3->super_PromiseFulfiller<void>).super_PromiseRejector.
                             _vptr_PromiseRejector);
  }
  node.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_5b0.promise;
  if (local_5b0.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_5b0.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  if (local_508 == 0) {
    EventLoop::leaveScope(local_518);
  }
  EventLoop::~EventLoop(local_338);
  UnixEventPort::~UnixEventPort(&local_128);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }